

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O3

bool amrex::StateDescriptor::bf_thread_safety
               (int *param_1,int *param_2,int *param_3,int *param_4,int *bc,int ng)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = true;
  if (0 < ng && bf_ext_dir_threadsafe == 0) {
    uVar2 = 1;
    do {
      lVar1 = uVar2 - 1;
      if ((uint)(ng * 6) <= uVar2) break;
      uVar2 = uVar2 + 1;
    } while (bc[lVar1] != 3);
    bVar3 = bc[lVar1] != 3;
  }
  return bVar3;
}

Assistant:

bool
StateDescriptor::bf_thread_safety (const int* /*lo*/,const int* /*hi*/,
                                   const int* /*dom_lo*/, const int* /*dom_hi*/,
                                   const int* bc, int ng)
{
    bool thread_safe = true;
    if (!bf_ext_dir_threadsafe) {
        bool has_ext_dir = false;
        for (int i=0; i<2*AMREX_SPACEDIM*ng && !has_ext_dir; ++i) {
            has_ext_dir = bc[i]==BCType::ext_dir;
        }
        if (has_ext_dir) thread_safe = false;
    }
    return thread_safe;
}